

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O3

void __thiscall QIBusPlatformInputContext::cursorRectChanged(QIBusPlatformInputContext *this)

{
  int *piVar1;
  QDebug QVar2;
  char cVar3;
  undefined4 uVar4;
  QPoint *pQVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  QDBusPendingReplyBase *this_00;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  int iVar11;
  int iVar12;
  int iVar16;
  int iVar17;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar18;
  uint uVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  QLatin1String QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QDBusPendingReplyBase local_c0;
  QRect local_b8;
  QDBusPendingReplyBase local_a8;
  QDebug local_a0;
  QRect local_98;
  undefined8 local_88;
  int iStack_80;
  int iStack_7c;
  int local_78;
  uint uStack_74;
  double dStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  char *local_60;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(*(long *)(this + 0x18) + 0x2a) == '\x01') {
    QGuiApplication::inputMethod();
    uVar4 = QInputMethod::cursorRectangle();
    auVar13._0_8_ =
         (double)(((ulong)uStack_74 & 0x80000000) << 0x20 | 0x3fe0000000000000) +
         (double)CONCAT44(uStack_74,local_78);
    auVar13._8_8_ = (double)((ulong)dStack_70 & 0x8000000000000000 | 0x3fe0000000000000) + dStack_70
    ;
    auVar14 = maxpd(auVar13,_DAT_00121200);
    iVar18 = (int)(double)(~-(ulong)(2147483647.0 < auVar13._0_8_) & auVar14._0_8_ |
                          -(ulong)(2147483647.0 < auVar13._0_8_) & 0x41dfffffffc00000);
    uVar20 = (uint)(double)(~-(ulong)(2147483647.0 < auVar13._8_8_) & auVar14._8_8_ |
                           -(ulong)(2147483647.0 < auVar13._8_8_) & 0x41dfffffffc00000);
    dVar9 = ((double)CONCAT44(uStack_74,local_78) - (double)iVar18) * 0.5 +
            (double)CONCAT44(uStack_64,local_68);
    dVar10 = (dStack_70 - (double)(int)uVar20) * 0.5 + (double)local_60;
    auVar15._0_8_ = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
    auVar15._8_8_ = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
    auVar14 = maxpd(auVar15,_DAT_00121200);
    iVar11 = (int)(double)(~-(ulong)(2147483647.0 < auVar15._0_8_) & auVar14._0_8_ |
                          -(ulong)(2147483647.0 < auVar15._0_8_) & 0x41dfffffffc00000);
    iVar16 = (int)(double)(~-(ulong)(2147483647.0 < auVar15._8_8_) & auVar14._8_8_ |
                          -(ulong)(2147483647.0 < auVar15._8_8_) & 0x41dfffffffc00000);
    iVar12 = -(uint)(iVar18 + -1 + iVar11 < iVar18);
    iVar17 = -(uint)((int)((uVar20 - 1) + iVar16) < (int)uVar20);
    auVar14._4_4_ = iVar12;
    auVar14._0_4_ = iVar12;
    auVar14._8_4_ = iVar17;
    auVar14._12_4_ = iVar17;
    iVar12 = movmskpd(uVar4,auVar14);
    if (iVar12 == 0) {
      pQVar5 = (QPoint *)QGuiApplication::focusWindow();
      if (pQVar5 != (QPoint *)0x0) {
        lVar6 = QWindow::screen();
        if (lVar6 != 0) {
          QGuiApplication::platformName();
          QVar22.m_data = (char *)0x7;
          QVar22.m_size = (qsizetype)&local_78;
          cVar3 = QString::startsWith(QVar22,0x1218cd);
          piVar1 = (int *)CONCAT44(uStack_74,local_78);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,0x10);
            }
          }
          if (cVar3 == '\0') {
            QWindow::screen();
            uVar7 = QScreen::geometry();
            local_78 = iVar18;
            uStack_74 = uVar20;
            uVar8 = QWindow::mapToGlobal(pQVar5);
            dVar9 = (double)QWindow::devicePixelRatio();
            iVar17 = (int)((ulong)uVar7 >> 0x20);
            dVar10 = (double)((int)uVar8 - (int)uVar7) * dVar9;
            auVar19._0_8_ =
                 (double)((ulong)((double)iVar11 * dVar9) & 0x8000000000000000 | 0x3fe0000000000000)
                 + (double)iVar11 * dVar9;
            auVar19._8_8_ =
                 (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
            auVar14 = maxpd(auVar19,_DAT_00121200);
            iVar12 = (int)uVar7 +
                     (int)(double)(~-(ulong)(2147483647.0 < auVar19._8_8_) & auVar14._8_8_ |
                                  -(ulong)(2147483647.0 < auVar19._8_8_) & 0x41dfffffffc00000);
            iVar11 = (int)(double)(~-(ulong)(2147483647.0 < auVar19._0_8_) & auVar14._0_8_ |
                                  -(ulong)(2147483647.0 < auVar19._0_8_) & 0x41dfffffffc00000) + -1
                     + iVar12;
            dVar10 = (double)((int)((ulong)uVar8 >> 0x20) - iVar17) * dVar9;
            auVar21._0_8_ =
                 (double)((ulong)((double)iVar16 * dVar9) & 0x8000000000000000 | 0x3fe0000000000000)
                 + (double)iVar16 * dVar9;
            auVar21._8_8_ =
                 (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
            auVar14 = maxpd(auVar21,_DAT_00121200);
            iVar17 = iVar17 + (int)(double)(~-(ulong)(2147483647.0 < auVar21._8_8_) & auVar14._8_8_
                                           | -(ulong)(2147483647.0 < auVar21._8_8_) &
                                             0x41dfffffffc00000);
            local_88 = CONCAT44(iVar17,iVar12);
            iVar16 = (int)(double)(~-(ulong)(2147483647.0 < auVar21._0_8_) & auVar14._0_8_ |
                                  -(ulong)(2147483647.0 < auVar21._0_8_) & 0x41dfffffffc00000) + -1
                     + iVar17;
            iStack_80 = iVar11;
            iStack_7c = iVar16;
            lcQpaInputMethods();
            if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i
                & 1) != 0) {
              local_78 = 2;
              uStack_74 = 0;
              dStack_70 = 0.0;
              local_68 = 0;
              uStack_64 = 0;
              local_60 = lcQpaInputMethods::category.name;
              QMessageLogger::debug();
              QVar2.stream = local_a0.stream;
              QVar24.m_data = (storage_type *)0xa;
              QVar24.m_size = (qsizetype)&local_50;
              QString::fromUtf8(QVar24);
              QTextStream::operator<<((QTextStream *)QVar2.stream,&local_50);
              if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
              }
              *(int *)((QTextStream *)local_a0.stream + 0x28) =
                   *(int *)((QTextStream *)local_a0.stream + 0x28) + 1;
              operator<<((QDebug)&local_b8.x2,&local_b8);
              QDebug::~QDebug((QDebug *)&local_b8.x2);
              QDebug::~QDebug((QDebug *)&local_b8);
              QDebug::~QDebug(&local_a0);
              iVar12 = (int)local_88;
              iVar11 = iStack_80;
              iVar17 = local_88._4_4_;
              iVar16 = iStack_7c;
            }
            this_00 = &local_c0;
            QIBusInputContextProxy::SetCursorLocation
                      ((QDBusPendingReply<> *)this_00,
                       *(QIBusInputContextProxy **)(*(long *)(this + 0x18) + 0x10),iVar12,iVar17,
                       (iVar11 - iVar12) + 1,(iVar16 - iVar17) + 1);
          }
          else {
            uVar7 = QWindow::frameMargins();
            dVar9 = (double)QWindow::devicePixelRatio();
            iVar12 = (int)((double)((int)uVar7 + iVar18) * dVar9);
            iVar17 = (int)((double)(int)((int)((ulong)uVar7 >> 0x20) + uVar20) * dVar9);
            uVar7 = CONCAT44(iVar17,iVar12);
            iVar12 = iVar12 + -1 + (int)((double)iVar11 * dVar9);
            iVar11 = iVar17 + -1 + (int)((double)iVar16 * dVar9);
            local_88 = uVar7;
            iStack_80 = iVar12;
            iStack_7c = iVar11;
            lcQpaInputMethods();
            if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i
                & 1) != 0) {
              local_78 = 2;
              uStack_74 = 0;
              dStack_70 = 0.0;
              local_68 = 0;
              uStack_64 = 0;
              local_60 = lcQpaInputMethods::category.name;
              QMessageLogger::debug();
              QVar2.stream = local_a0.stream;
              QVar23.m_data = (storage_type *)0xa;
              QVar23.m_size = (qsizetype)&local_50;
              QString::fromUtf8(QVar23);
              QTextStream::operator<<((QTextStream *)QVar2.stream,&local_50);
              if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
              }
              *(int *)((QTextStream *)local_a0.stream + 0x28) =
                   *(int *)((QTextStream *)local_a0.stream + 0x28) + 1;
              operator<<((QDebug)&local_98.x2,&local_98);
              QDebug::~QDebug((QDebug *)&local_98.x2);
              QDebug::~QDebug((QDebug *)&local_98);
              QDebug::~QDebug(&local_a0);
              uVar7 = local_88;
              iVar12 = iStack_80;
              iVar11 = iStack_7c;
            }
            iVar16 = (int)((ulong)uVar7 >> 0x20);
            this_00 = &local_a8;
            QIBusInputContextProxy::SetCursorLocationRelative
                      ((QDBusPendingReply<> *)this_00,
                       *(QIBusInputContextProxy **)(*(long *)(this + 0x18) + 0x10),(int)uVar7,iVar16
                       ,(iVar12 - (int)uVar7) + 1,(iVar11 - iVar16) + 1);
          }
          QDBusPendingReplyBase::~QDBusPendingReplyBase(this_00);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIBusPlatformInputContext::cursorRectChanged()
{
    if (!d->busConnected)
        return;

    QRect r = qApp->inputMethod()->cursorRectangle().toRect();
    if (!r.isValid())
        return;

    QWindow *inputWindow = qApp->focusWindow();
    if (!inputWindow)
        return;
    if (!inputWindow->screen())
        return;

    if (QGuiApplication::platformName().startsWith("wayland"_L1)) {
        auto margins = inputWindow->frameMargins();
        r.translate(margins.left(), margins.top());
        qreal scale = inputWindow->devicePixelRatio();
        QRect newRect = QRect(r.x() * scale, r.y() * scale, r.width() * scale, r.height() * scale);
        qCDebug(lcQpaInputMethods) << "microFocus" << newRect;
        d->context->SetCursorLocationRelative(newRect.x(), newRect.y(),
                                              newRect.width(), newRect.height());
        return;
    }

    // x11/xcb
    auto screenGeometry = inputWindow->screen()->geometry();
    auto point = inputWindow->mapToGlobal(r.topLeft());
    qreal scale = inputWindow->devicePixelRatio();
    auto native = (point - screenGeometry.topLeft()) * scale + screenGeometry.topLeft();
    QRect newRect(native, r.size() * scale);
    qCDebug(lcQpaInputMethods) << "microFocus" << newRect;
    d->context->SetCursorLocation(newRect.x(), newRect.y(),
                                  newRect.width(), newRect.height());
}